

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwbase.h
# Opt level: O2

Quat rw::Quat::rotation(float32 angle,V3d *axis)

{
  float fVar1;
  float fVar2;
  Quat QVar3;
  V3d VVar4;
  undefined4 local_28;
  undefined4 uStack_24;
  
  fVar1 = cosf((float)angle * 0.5);
  VVar4 = normalize(axis);
  fVar2 = sinf((float)angle * 0.5);
  QVar3.z = (float)VVar4.z * fVar2;
  local_28 = (float)VVar4.x;
  uStack_24 = (float)VVar4.y;
  QVar3.x = fVar2 * local_28;
  QVar3.y = fVar2 * uStack_24;
  QVar3.w = (float32)fVar1;
  return QVar3;
}

Assistant:

static Quat rotation(float32 angle, const V3d &axis){
		return makeQuat(cosf(angle/2.0f), scale(normalize(axis), sinf(angle/2.0f))); }